

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleClientProtocolError
          (HttpServerErrorHandler *this,ProtocolError protocolError,Response *response)

{
  StringPtr *in_RCX;
  long lVar1;
  undefined8 *in_RDX;
  char *pcVar2;
  StringPtr value;
  undefined1 local_f8 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  String errorMessage;
  HttpHeaderTable headerTable;
  HttpHeaders headers;
  
  HttpHeaderTable::HttpHeaderTable(&headerTable);
  HttpHeaders::HttpHeaders(&headers,&headerTable);
  value.content.size_ = 0xb;
  value.content.ptr = "text/plain";
  anon_unknown_36::requireValidHeaderValue(value);
  headers.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  headers.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  str<char_const(&)[8],kj::StringPtr&>
            (&errorMessage,(kj *)"ERROR: ",(char (*) [8])&protocolError.description,in_RCX);
  (**(code **)*in_RDX)(&body);
  pcVar2 = (char *)errorMessage.content.size_;
  if (errorMessage.content.size_ != 0) {
    pcVar2 = errorMessage.content.ptr;
  }
  lVar1 = 0;
  if (errorMessage.content.size_ != 0) {
    lVar1 = errorMessage.content.size_ - 1;
  }
  (**(body.ptr)->_vptr_AsyncOutputStream)(local_f8,body.ptr,pcVar2,lVar1);
  Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(String *)local_f8,
             (Own<kj::AsyncOutputStream,_std::nullptr_t> *)&errorMessage);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f8);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&body);
  Array<char>::~Array(&errorMessage.content);
  HttpHeaders::~HttpHeaders(&headers);
  HttpHeaderTable::~HttpHeaderTable(&headerTable);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleClientProtocolError(
    HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) {
  // Default error handler implementation.

  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  auto errorMessage = kj::str("ERROR: ", protocolError.description);
  auto body = response.send(protocolError.statusCode, protocolError.statusMessage,
                            headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
}